

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O3

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerTest *this)

{
  pointer pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec4 *pVVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  createTestQuadMosaic(__return_storage_ptr__,this->m_imageViewType);
  pVVar1 = (__return_storage_ptr__->
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(__return_storage_ptr__->
                super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar6 != 0) {
    pVVar5 = &pVVar1->texCoord;
    uVar7 = 1;
    do {
      fVar2 = pVVar5->m_data[1];
      fVar3 = pVVar5->m_data[2];
      fVar4 = pVVar5->m_data[3];
      pVVar5->m_data[0] = pVVar5->m_data[0] + 0.002;
      pVVar5->m_data[1] = fVar2 + 0.002;
      pVVar5->m_data[2] = fVar3 + 0.002;
      pVVar5->m_data[3] = fVar4 + 0.0;
      uVar8 = (ulong)uVar7;
      pVVar5 = pVVar5 + 2;
      uVar7 = uVar7 + 1;
    } while (uVar8 < (ulong)(lVar6 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = createTestQuadMosaic(m_imageViewType);
	// Adjust texture coordinate to avoid doing NEAREST filtering exactly on texel boundaries.
	// TODO: Would be nice to base this on number of texels and subtexel precision. But this
	// seems to work.
	for (unsigned int i = 0; i < vertices.size(); ++i) {
		vertices[i].texCoord += tcu::Vec4(0.002f, 0.002f, 0.002f, 0.0f);
	}
	return vertices;
}